

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parse_cfg.c
# Opt level: O1

char * get_opt_value(char *line)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  char *__s;
  
  sVar2 = strlen(line);
  if (sVar2 != 0) {
    pcVar3 = line + 1;
    while (pcVar3[-1] != ':') {
      pcVar3 = pcVar3 + 1;
      sVar2 = sVar2 - 1;
      if (sVar2 == 0) {
        return (char *)0x0;
      }
    }
    if (pcVar3 != (char *)0x0) {
      do {
        __s = pcVar3;
        pcVar3 = __s + 1;
      } while (*__s == ' ');
      sVar2 = strlen(__s);
      pcVar3 = __s + 1 + sVar2;
      do {
        pcVar1 = pcVar3 + -2;
        pcVar3 = pcVar3 + -1;
      } while (*pcVar1 == ' ');
      *pcVar3 = '\0';
      return __s;
    }
  }
  return (char *)0x0;
}

Assistant:

static char *get_opt_value(char *line)
{
    size_t i;

    for (i = 0; i < strlen(line); ++i) {
        if (line[i] == ':')
            return string_trim(&line[i + 1]);
    }

    return NULL;
}